

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O3

bool modify_stat(string *name,function<int_(int)> *f,Character *victim)

{
  World *pWVar1;
  ECF *pEVar2;
  bool bVar3;
  bool bVar4;
  AdminLevel AVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  mapped_type *pmVar9;
  uchar uVar10;
  Skin SVar11;
  int iVar12;
  AdminLevel AVar13;
  uint uVar14;
  PacketBuilder builder;
  undefined1 local_80 [48];
  key_type local_50;
  
  iVar6 = std::__cxx11::string::compare((char *)name);
  if (iVar6 == 0) {
    local_80._1_3_ = 0;
    local_80[0] = victim->level;
    if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00187a8d;
    iVar12 = (*f->_M_invoker)((_Any_data *)f,(int *)local_80);
    pWVar1 = victim->world;
    local_80._0_8_ = local_80 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"MaxLevel","");
    pmVar9 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pWVar1->config,(key_type *)local_80);
    iVar8 = util::variant::GetInt(pmVar9);
    iVar6 = 0;
    if (0 < iVar12) {
      iVar6 = iVar12;
    }
    uVar10 = (uchar)iVar6;
    if (iVar8 < iVar6) {
      uVar10 = (uchar)iVar8;
    }
    victim->level = uVar10;
LAB_0018704e:
    if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
      operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
    }
    bVar3 = true;
  }
  else {
    iVar6 = std::__cxx11::string::compare((char *)name);
    if (iVar6 == 0) {
      local_80._0_4_ = victim->exp;
      if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00187a8d;
      iVar12 = (*f->_M_invoker)((_Any_data *)f,(int *)local_80);
      pWVar1 = victim->world;
      local_80._0_8_ = local_80 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"MaxEXP","");
      pmVar9 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,(key_type *)local_80);
      iVar8 = util::variant::GetInt(pmVar9);
      iVar6 = 0;
      if (0 < iVar12) {
        iVar6 = iVar12;
      }
      if (iVar8 < iVar6) {
        iVar6 = iVar8;
      }
      victim->exp = iVar6;
      goto LAB_0018704e;
    }
    iVar6 = std::__cxx11::string::compare((char *)name);
    if (iVar6 == 0) {
      local_80._0_4_ = victim->str;
      if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00187a8d;
      iVar12 = (*f->_M_invoker)((_Any_data *)f,(int *)local_80);
      pWVar1 = victim->world;
      local_80._0_8_ = local_80 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"MaxStat","");
      pmVar9 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,(key_type *)local_80);
      iVar8 = util::variant::GetInt(pmVar9);
      iVar6 = 0;
      if (0 < iVar12) {
        iVar6 = iVar12;
      }
      if (iVar8 < iVar6) {
        iVar6 = iVar8;
      }
      victim->str = iVar6;
LAB_001873c2:
      if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
        operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
      }
      bVar4 = true;
      bVar3 = false;
LAB_001873df:
      Character::CalculateStats(victim,true);
      PacketBuilder::PacketBuilder((PacketBuilder *)local_80,PACKET_RECOVER,PACKET_LIST,0x20);
      if (bVar3) {
        PacketBuilder::SetID((PacketBuilder *)local_80,PACKET_STATSKILL,PACKET_PLAYER);
        uVar14 = victim->statpoints;
      }
      else {
        uVar14 = (uint)victim->clas;
      }
      PacketBuilder::AddShort((PacketBuilder *)local_80,uVar14);
      PacketBuilder::AddShort((PacketBuilder *)local_80,*victim->display_str);
      PacketBuilder::AddShort((PacketBuilder *)local_80,*victim->display_intl);
      PacketBuilder::AddShort((PacketBuilder *)local_80,*victim->display_wis);
      PacketBuilder::AddShort((PacketBuilder *)local_80,*victim->display_agi);
      PacketBuilder::AddShort((PacketBuilder *)local_80,*victim->display_con);
      PacketBuilder::AddShort((PacketBuilder *)local_80,*victim->display_cha);
      PacketBuilder::AddShort((PacketBuilder *)local_80,victim->maxhp);
      PacketBuilder::AddShort((PacketBuilder *)local_80,victim->maxtp);
      PacketBuilder::AddShort((PacketBuilder *)local_80,victim->maxsp);
      PacketBuilder::AddShort((PacketBuilder *)local_80,victim->maxweight);
      PacketBuilder::AddShort((PacketBuilder *)local_80,victim->mindam);
      PacketBuilder::AddShort((PacketBuilder *)local_80,victim->maxdam);
      PacketBuilder::AddShort((PacketBuilder *)local_80,victim->accuracy);
      PacketBuilder::AddShort((PacketBuilder *)local_80,victim->evade);
      PacketBuilder::AddShort((PacketBuilder *)local_80,victim->armor);
      Character::Send(victim,(PacketBuilder *)local_80);
      PacketBuilder::~PacketBuilder((PacketBuilder *)local_80);
      if (bVar4) {
        return true;
      }
      goto LAB_00187557;
    }
    iVar6 = std::__cxx11::string::compare((char *)name);
    if (iVar6 == 0) {
      local_80._0_4_ = victim->intl;
      if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00187a8d;
      iVar12 = (*f->_M_invoker)((_Any_data *)f,(int *)local_80);
      pWVar1 = victim->world;
      local_80._0_8_ = local_80 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"MaxStat","");
      pmVar9 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,(key_type *)local_80);
      iVar8 = util::variant::GetInt(pmVar9);
      iVar6 = 0;
      if (0 < iVar12) {
        iVar6 = iVar12;
      }
      if (iVar8 < iVar6) {
        iVar6 = iVar8;
      }
      victim->intl = iVar6;
      goto LAB_001873c2;
    }
    iVar6 = std::__cxx11::string::compare((char *)name);
    if (iVar6 == 0) {
      local_80._0_4_ = victim->wis;
      if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00187a8d;
      iVar12 = (*f->_M_invoker)((_Any_data *)f,(int *)local_80);
      pWVar1 = victim->world;
      local_80._0_8_ = local_80 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"MaxStat","");
      pmVar9 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,(key_type *)local_80);
      iVar8 = util::variant::GetInt(pmVar9);
      iVar6 = 0;
      if (0 < iVar12) {
        iVar6 = iVar12;
      }
      if (iVar8 < iVar6) {
        iVar6 = iVar8;
      }
      victim->wis = iVar6;
      goto LAB_001873c2;
    }
    iVar6 = std::__cxx11::string::compare((char *)name);
    if (iVar6 == 0) {
      local_80._0_4_ = victim->agi;
      if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00187a8d;
      iVar12 = (*f->_M_invoker)((_Any_data *)f,(int *)local_80);
      pWVar1 = victim->world;
      local_80._0_8_ = local_80 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"MaxStat","");
      pmVar9 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,(key_type *)local_80);
      iVar8 = util::variant::GetInt(pmVar9);
      iVar6 = 0;
      if (0 < iVar12) {
        iVar6 = iVar12;
      }
      if (iVar8 < iVar6) {
        iVar6 = iVar8;
      }
      victim->agi = iVar6;
      goto LAB_001873c2;
    }
    iVar6 = std::__cxx11::string::compare((char *)name);
    if (iVar6 == 0) {
      local_80._0_4_ = victim->con;
      if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00187a8d;
      iVar12 = (*f->_M_invoker)((_Any_data *)f,(int *)local_80);
      pWVar1 = victim->world;
      local_80._0_8_ = local_80 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"MaxStat","");
      pmVar9 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,(key_type *)local_80);
      iVar8 = util::variant::GetInt(pmVar9);
      iVar6 = 0;
      if (0 < iVar12) {
        iVar6 = iVar12;
      }
      if (iVar8 < iVar6) {
        iVar6 = iVar8;
      }
      victim->con = iVar6;
      goto LAB_001873c2;
    }
    iVar6 = std::__cxx11::string::compare((char *)name);
    if (iVar6 == 0) {
      local_80._0_4_ = victim->cha;
      if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00187a8d;
      iVar12 = (*f->_M_invoker)((_Any_data *)f,(int *)local_80);
      pWVar1 = victim->world;
      local_80._0_8_ = local_80 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"MaxStat","");
      pmVar9 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,(key_type *)local_80);
      iVar8 = util::variant::GetInt(pmVar9);
      iVar6 = 0;
      if (0 < iVar12) {
        iVar6 = iVar12;
      }
      if (iVar8 < iVar6) {
        iVar6 = iVar8;
      }
      victim->cha = iVar6;
      goto LAB_001873c2;
    }
    iVar6 = std::__cxx11::string::compare((char *)name);
    if (iVar6 == 0) {
      local_80._0_4_ = victim->statpoints;
      if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00187a8d;
      iVar12 = (*f->_M_invoker)((_Any_data *)f,(int *)local_80);
      pWVar1 = victim->world;
      local_80._0_8_ = local_80 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"MaxLevel","");
      pmVar9 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,(key_type *)local_80);
      iVar8 = util::variant::GetInt(pmVar9);
      pWVar1 = victim->world;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"StatPerLevel","");
      pmVar9 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,&local_50);
      iVar7 = util::variant::GetInt(pmVar9);
      iVar6 = 0;
      if (0 < iVar12) {
        iVar6 = iVar12;
      }
      if (iVar7 * iVar8 < iVar6) {
        iVar6 = iVar7 * iVar8;
      }
      victim->statpoints = iVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
        operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
      }
      bVar3 = true;
      bVar4 = false;
      goto LAB_001873df;
    }
    iVar6 = std::__cxx11::string::compare((char *)name);
    if (iVar6 == 0) {
      local_80._0_4_ = victim->skillpoints;
      if ((f->super__Function_base)._M_manager != (_Manager_type)0x0) {
        iVar12 = (*f->_M_invoker)((_Any_data *)f,(int *)local_80);
        pWVar1 = victim->world;
        local_80._0_8_ = local_80 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"MaxLevel","");
        pmVar9 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&pWVar1->config,(key_type *)local_80);
        iVar8 = util::variant::GetInt(pmVar9);
        pWVar1 = victim->world;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"SkillPerLevel","");
        pmVar9 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&pWVar1->config,&local_50);
        iVar7 = util::variant::GetInt(pmVar9);
        iVar6 = 0;
        if (0 < iVar12) {
          iVar6 = iVar12;
        }
        if (iVar7 * iVar8 < iVar6) {
          iVar6 = iVar7 * iVar8;
        }
        victim->skillpoints = iVar6;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_80._0_8_ == local_80 + 0x10) {
          return true;
        }
        operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
        return true;
      }
LAB_00187a8d:
      std::__throw_bad_function_call();
    }
    iVar6 = std::__cxx11::string::compare((char *)name);
    if (iVar6 == 0) {
      local_80._1_3_ = 0;
      local_80[0] = victim->admin;
      if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00187a8d;
      iVar6 = (*f->_M_invoker)((_Any_data *)f,(int *)local_80);
      AVar5 = (AdminLevel)iVar6;
      AVar13 = ADMIN_HGM;
      if (AVar5 < ADMIN_HGM) {
        AVar13 = AVar5;
      }
      if (AVar5 == ADMIN_PLAYER) {
        iVar6 = -1;
        if (victim->admin != ADMIN_PLAYER) goto LAB_00187867;
      }
      else if (victim->admin == ADMIN_PLAYER) {
        iVar6 = 1;
LAB_00187867:
        World::UpdateAdminCount(victim->world,iVar6 + victim->world->admin_count);
      }
      victim->admin = AVar13;
      goto LAB_00187557;
    }
    iVar6 = std::__cxx11::string::compare((char *)name);
    if (iVar6 == 0) {
      local_80._1_3_ = 0;
      local_80[0] = victim->gender;
      if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00187a8d;
      iVar6 = (*f->_M_invoker)((_Any_data *)f,(int *)local_80);
      victim->gender = (char)iVar6 != '\0';
      goto LAB_0018798c;
    }
    iVar6 = std::__cxx11::string::compare((char *)name);
    if (iVar6 == 0) {
      local_80._1_3_ = 0;
      local_80[0] = victim->hairstyle;
      if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00187a8d;
      iVar12 = (*f->_M_invoker)((_Any_data *)f,(int *)local_80);
      pWVar1 = victim->world;
      local_80._0_8_ = local_80 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"MaxHairStyle","");
      pmVar9 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,(key_type *)local_80);
      iVar8 = util::variant::GetInt(pmVar9);
      iVar6 = 0;
      if (0 < iVar12) {
        iVar6 = iVar12;
      }
      uVar10 = (uchar)iVar6;
      if (iVar8 < iVar6) {
        uVar10 = (uchar)iVar8;
      }
      victim->hairstyle = uVar10;
LAB_00187975:
      if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
        operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
      }
LAB_0018798c:
      Character::Warp(victim,victim->map->id,victim->x,victim->y,WARP_ANIMATION_NONE);
      return true;
    }
    iVar6 = std::__cxx11::string::compare((char *)name);
    if (iVar6 == 0) {
      local_80._1_3_ = 0;
      local_80[0] = victim->haircolor;
      if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00187a8d;
      iVar12 = (*f->_M_invoker)((_Any_data *)f,(int *)local_80);
      pWVar1 = victim->world;
      local_80._0_8_ = local_80 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"MaxHairColor","");
      pmVar9 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,(key_type *)local_80);
      iVar8 = util::variant::GetInt(pmVar9);
      iVar6 = 0;
      if (0 < iVar12) {
        iVar6 = iVar12;
      }
      uVar10 = (uchar)iVar6;
      if (iVar8 < iVar6) {
        uVar10 = (uchar)iVar8;
      }
      victim->haircolor = uVar10;
      goto LAB_00187975;
    }
    iVar6 = std::__cxx11::string::compare((char *)name);
    if (iVar6 == 0) {
      local_80._1_3_ = 0;
      local_80[0] = victim->race;
      if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00187a8d;
      iVar6 = (*f->_M_invoker)((_Any_data *)f,(int *)local_80);
      pWVar1 = victim->world;
      local_80._0_8_ = local_80 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"MaxSkin","");
      pmVar9 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,(key_type *)local_80);
      iVar12 = util::variant::GetInt(pmVar9);
      SVar11 = (Skin)iVar6;
      if ((Skin)iVar12 < (Skin)iVar6) {
        SVar11 = (Skin)iVar12;
      }
      victim->race = SVar11;
      goto LAB_00187975;
    }
    iVar6 = std::__cxx11::string::compare((char *)name);
    if (iVar6 == 0) {
      local_80._1_3_ = 0;
      local_80[0] = victim->guild_rank;
      if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00187a8d;
      iVar12 = (*f->_M_invoker)((_Any_data *)f,(int *)local_80);
      iVar6 = 0;
      if (0 < iVar12) {
        iVar6 = iVar12;
      }
      uVar10 = '\t';
      if (iVar6 < 9) {
        uVar10 = (uchar)iVar6;
      }
      victim->guild_rank = uVar10;
      goto LAB_00187557;
    }
    iVar6 = std::__cxx11::string::compare((char *)name);
    if (iVar6 != 0) {
      iVar6 = std::__cxx11::string::compare((char *)name);
      if (iVar6 != 0) {
        return false;
      }
      local_80._1_3_ = 0;
      local_80[0] = victim->clas;
      if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00187a8d;
      iVar6 = (*f->_M_invoker)((_Any_data *)f,(int *)local_80);
      pEVar2 = victim->world->ecf;
      iVar12 = (int)((ulong)((long)(pEVar2->data).
                                   super__Vector_base<ECF_Data_Base<ECF>,_std::allocator<ECF_Data_Base<ECF>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pEVar2->data).
                                  super__Vector_base<ECF_Data_Base<ECF>,_std::allocator<ECF_Data_Base<ECF>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249 +
               -1;
      bVar3 = false;
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      uVar10 = (uchar)iVar6;
      if (iVar12 < iVar6) {
        uVar10 = (uchar)iVar12;
      }
      victim->clas = uVar10;
      bVar4 = true;
      goto LAB_001873df;
    }
    local_80._0_4_ = victim->karma;
    if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00187a8d;
    iVar6 = (*f->_M_invoker)((_Any_data *)f,(int *)local_80);
    bVar3 = false;
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    if (1999 < iVar6) {
      iVar6 = 2000;
    }
    victim->karma = iVar6;
  }
  PacketBuilder::PacketBuilder((PacketBuilder *)local_80,PACKET_RECOVER,PACKET_REPLY,7);
  PacketBuilder::AddInt((PacketBuilder *)local_80,victim->exp);
  PacketBuilder::AddShort((PacketBuilder *)local_80,victim->karma);
  uVar14 = 0;
  if (bVar3) {
    uVar14 = (uint)victim->level;
  }
  PacketBuilder::AddChar((PacketBuilder *)local_80,uVar14);
  Character::Send(victim,(PacketBuilder *)local_80);
  PacketBuilder::~PacketBuilder((PacketBuilder *)local_80);
LAB_00187557:
  Character::CheckQuestRules(victim);
  return true;
}

Assistant:

static bool modify_stat(std::string name, std::function<int(int)> f, Character* victim)
{
	bool appearance = false;
	bool level = false;
	bool stats = false;
	bool karma = false;

	bool statpoints = false;
	bool skillpoints = false;

		 if (name == "level") (level = true, victim->level) = util::clamp<int>(f(victim->level), 0, victim->world->config["MaxLevel"]);
	else if (name == "exp")   (level = true, victim->exp)   = util::clamp<int>(f(victim->exp),   0, victim->world->config["MaxEXP"]);
	else if (name == "str")   (stats = true, victim->str)   = util::clamp<int>(f(victim->str),   0, victim->world->config["MaxStat"]);
	else if (name == "int")   (stats = true, victim->intl)  = util::clamp<int>(f(victim->intl),  0, victim->world->config["MaxStat"]);
	else if (name == "wis")   (stats = true, victim->wis)   = util::clamp<int>(f(victim->wis),   0, victim->world->config["MaxStat"]);
	else if (name == "agi")   (stats = true, victim->agi)   = util::clamp<int>(f(victim->agi),   0, victim->world->config["MaxStat"]);
	else if (name == "con")   (stats = true, victim->con)   = util::clamp<int>(f(victim->con),   0, victim->world->config["MaxStat"]);
	else if (name == "cha")   (stats = true, victim->cha)   = util::clamp<int>(f(victim->cha),   0, victim->world->config["MaxStat"]);
	else if (name == "statpoints")  (statpoints = true,  victim->statpoints)  = util::clamp<int>(f(victim->statpoints),  0, int(victim->world->config["MaxLevel"]) * int(victim->world->config["StatPerLevel"]));
	else if (name == "skillpoints") (skillpoints = true, victim->skillpoints) = util::clamp<int>(f(victim->skillpoints), 0, int(victim->world->config["MaxLevel"]) * int(victim->world->config["SkillPerLevel"]));
	else if (name == "admin")
	{
		AdminLevel level = util::clamp<AdminLevel>(AdminLevel(f(victim->admin)), ADMIN_PLAYER, ADMIN_HGM);

		if (level == ADMIN_PLAYER && victim->admin != ADMIN_PLAYER)
			victim->world->DecAdminCount();
		else if (level != ADMIN_PLAYER && victim->admin == ADMIN_PLAYER)
			victim->world->IncAdminCount();

		victim->admin = level;
	}
	else if (name == "gender")    (appearance = true, victim->gender)    = util::clamp<Gender>(Gender(f(victim->gender)), Gender(0), Gender(1));
	else if (name == "hairstyle") (appearance = true, victim->hairstyle) = util::clamp<int>(f(victim->hairstyle),         0, victim->world->config["MaxHairStyle"]);
	else if (name == "haircolor") (appearance = true, victim->haircolor) = util::clamp<int>(f(victim->haircolor),         0, victim->world->config["MaxHairColor"]);
	else if (name == "race")      (appearance = true, victim->race)      = util::clamp<Skin>(Skin(f(victim->race)),       Skin(0), Skin(int(victim->world->config["MaxSkin"])));
	else if (name == "guildrank") victim->guild_rank = util::clamp<int>(f(victim->guild_rank), 0, 9);
	else if (name == "karma") (karma = true, victim->karma) = util::clamp<int>(f(victim->karma), 0, 2000);
	else if (name == "class") (stats = true, victim->clas)  = util::clamp<int>(f(victim->clas),  0, victim->world->ecf->data.size() - 1);
	else return false;

	// Easiest way to get the character to update on everyone nearby's screen
	if (appearance)
		victim->Warp(victim->map->id, victim->x, victim->y);

	// TODO: Good way of updating skillpoints
	(void)skillpoints;

	if (stats || statpoints)
	{
		victim->CalculateStats();

		PacketBuilder builder(PACKET_RECOVER, PACKET_LIST, 32);

		if (statpoints)
		{
			builder.SetID(PACKET_STATSKILL, PACKET_PLAYER);
			builder.AddShort(victim->statpoints);
		}
		else
		{
			builder.AddShort(victim->clas);
		}

		builder.AddShort(victim->display_str);
		builder.AddShort(victim->display_intl);
		builder.AddShort(victim->display_wis);
		builder.AddShort(victim->display_agi);
		builder.AddShort(victim->display_con);
		builder.AddShort(victim->display_cha);
		builder.AddShort(victim->maxhp);
		builder.AddShort(victim->maxtp);
		builder.AddShort(victim->maxsp);
		builder.AddShort(victim->maxweight);
		builder.AddShort(victim->mindam);
		builder.AddShort(victim->maxdam);
		builder.AddShort(victim->accuracy);
		builder.AddShort(victim->evade);
		builder.AddShort(victim->armor);
		victim->Send(builder);
	}

	if (karma || level)
	{
		PacketBuilder builder(PACKET_RECOVER, PACKET_REPLY, 7);
		builder.AddInt(victim->exp);
		builder.AddShort(victim->karma);
		builder.AddChar(level ? victim->level : 0);
		victim->Send(builder);
	}

	if (!stats && !skillpoints && !appearance)
	{
		victim->CheckQuestRules();
	}

	return true;
}